

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median.h
# Opt level: O0

Cacheblock<4U>_conflict *
med3char<Cacheblock<4u>,Cmp>
          (Cacheblock<4U>_conflict *a,Cacheblock<4U>_conflict *b,Cacheblock<4U>_conflict *c)

{
  int iVar1;
  Cacheblock<4U>_conflict *c_local;
  Cacheblock<4U>_conflict *b_local;
  Cacheblock<4U>_conflict *a_local;
  Cacheblock<4U>_conflict *local_10;
  
  iVar1 = Cmp::operator()((Cmp *)((long)&a_local + 7),a,b);
  local_10 = a;
  if (((iVar1 != 0) &&
      (iVar1 = Cmp::operator()((Cmp *)((long)&a_local + 7),c,a), local_10 = c, iVar1 != 0)) &&
     (iVar1 = Cmp::operator()((Cmp *)((long)&a_local + 7),c,b), iVar1 != 0)) {
    iVar1 = Cmp::operator()((Cmp *)((long)&a_local + 7),a,b);
    local_10 = b;
    if (iVar1 < 0) {
      iVar1 = Cmp::operator()((Cmp *)((long)&a_local + 7),b,c);
      if ((-1 < iVar1) &&
         (iVar1 = Cmp::operator()((Cmp *)((long)&a_local + 7),a,c), local_10 = a, iVar1 < 0)) {
        local_10 = c;
      }
    }
    else {
      iVar1 = Cmp::operator()((Cmp *)((long)&a_local + 7),b,c);
      if ((iVar1 < 1) &&
         (iVar1 = Cmp::operator()((Cmp *)((long)&a_local + 7),a,c), local_10 = c, iVar1 < 0)) {
        local_10 = a;
      }
    }
  }
  return local_10;
}

Assistant:

CharT&
med3char(CharT& a, CharT& b, CharT& c, Cmp cmp)
{
	if (cmp(a, b) == 0)                   return a;
	if (cmp(c, a) == 0 or cmp(c, b) == 0) return c;
	if (cmp(a, b) < 0) {
		if (cmp(b, c) < 0) return b;
		if (cmp(a, c) < 0) return c;
		return a;
	}
	if (cmp(b, c) > 0) return b;
	if (cmp(a, c) < 0) return a;
	return c;
}